

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void assert_same_file(char *file1,char *file2,bool expected)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = QUtil::same_file(file1,file2);
  poVar2 = std::operator<<((ostream *)&std::cout,"file1: -");
  if (file1 == (char *)0x0) {
    file1 = "(null)";
  }
  poVar2 = std::operator<<(poVar2,file1);
  poVar2 = std::operator<<(poVar2,"-, file2: -");
  if (file2 == (char *)0x0) {
    file2 = "(null)";
  }
  poVar2 = std::operator<<(poVar2,file2);
  poVar2 = std::operator<<(poVar2,"-; same: ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  poVar2 = std::operator<<(poVar2,": ");
  pcVar3 = "PASS";
  if (bVar1 != expected) {
    pcVar3 = "FAIL";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
assert_same_file(char const* file1, char const* file2, bool expected)
{
    bool actual = QUtil::same_file(file1, file2);
    std::cout << "file1: -" << (file1 ? file1 : "(null)") << "-, file2: -"
              << (file2 ? file2 : "(null)") << "-; same: " << actual << ": "
              << ((actual == expected) ? "PASS" : "FAIL") << std::endl;
}